

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O1

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,SpatialVector *axis_0)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  SpatialVector *axis;
  undefined4 in_ECX;
  int iVar9;
  undefined4 uVar10;
  
  this->mDoFCount = 1;
  axis = (SpatialVector *)operator_new__(0x30);
  this->mJointAxes = axis;
  dVar2 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar6 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar7 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar8 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar8;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = dVar6;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar7;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = dVar2;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
  dVar2 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  auVar4._4_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[1] != 0.0);
  auVar4._0_4_ = -(uint)(dVar2 != 1.0);
  auVar4._8_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] != 0.0);
  auVar4._12_4_ =
       -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] != 0.0);
  iVar9 = movmskps(in_ECX,auVar4);
  if ((((iVar9 != 0) ||
       (dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [4], dVar1 != 0.0)) || (NAN(dVar1))) ||
     ((dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [5], dVar1 != 0.0 || (NAN(dVar1))))) {
    if (((dVar2 != 0.0) ||
        ((NAN(dVar2) ||
         (auVar5._4_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] != 0.0),
         auVar5._0_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1] != 1.0),
         auVar5._8_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[3] != 0.0),
         auVar5._12_4_ =
              -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[4] != 0.0), iVar9 = movmskps(iVar9,auVar5), (char)iVar9 != '\0')))) ||
       ((dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5], dVar1 != 0.0 || (NAN(dVar1))))) {
      if ((((dVar2 != 0.0) || (NAN(dVar2))) ||
          (dVar2 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1], dVar2 != 0.0)) ||
         ((NAN(dVar2) ||
          (auVar3._4_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[3] != 0.0),
          auVar3._0_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] != 1.0),
          auVar3._8_4_ = -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[4] != 0.0),
          auVar3._12_4_ =
               -(uint)((axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[5] != 0.0), uVar10 = movmskps(iVar9,auVar3), (char)uVar10 != '\0'))))
      {
        this->mJointType = JointType1DoF;
      }
      else {
        this->mJointType = JointTypeRevoluteZ;
      }
    }
    else {
      this->mJointType = JointTypeRevoluteY;
    }
  }
  else {
    this->mJointType = JointTypeRevoluteX;
  }
  validate_spatial_axis(this,axis);
  return;
}

Assistant:

Joint (
			const Math::SpatialVector &axis_0
			) {
		mDoFCount = 1;
		mJointAxes = new Math::SpatialVector[mDoFCount];
		mJointAxes[0] = Math::SpatialVector (axis_0);
		if (axis_0 == Math::SpatialVector(1., 0., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteX;
		} else if (axis_0 == Math::SpatialVector(0., 1., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteY;
		} else if (axis_0 == Math::SpatialVector(0., 0., 1., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteZ;
		} else {
			mJointType = JointType1DoF;
		}
		validate_spatial_axis (mJointAxes[0]);
	}